

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecutorTests.cpp
# Opt level: O2

void __thiscall
ExecutorTest_Assignment_Test::~ExecutorTest_Assignment_Test(ExecutorTest_Assignment_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ExecutorTest, Assignment)
{
  std::string source = R"SRC(
  fn main(): f32
  {
    let m: f32 = 1;
    m = 2;
    print("" : m);
    m += 2;
    print("" : m);
    m <<= 1;
    print("" : m);
    ret 0;
  }
  )SRC";

  std::string expected = "2.000000\n4.000000\n8.000000\n";

  testProgram(source, expected, 0);
}